

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O3

void TPZShapeHDiv<pzshape::TPZShapeTetra>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  long *plVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  TPZManVector<int,_27> scalarOrders;
  int aiStack_158 [2];
  TPZManVector<int,_20> local_150;
  TPZManVector<int,_27> local_c0;
  long lVar11;
  
  piVar2 = local_150.fExtAlloc;
  local_150.super_TPZVec<int>.fStore = (int *)0x0;
  local_150.super_TPZVec<int>.fNElements = 0;
  local_150.super_TPZVec<int>.fNAlloc = 0;
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b7200;
  uVar9 = ids->fNElements;
  if ((long)uVar9 < 9) {
    local_150.super_TPZVec<int>.fStore = local_150.fExtAlloc;
    if (0 < (long)uVar9) goto LAB_0100725c;
  }
  else {
    local_150.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8);
    local_150.super_TPZVec<int>.fNAlloc = uVar9;
LAB_0100725c:
    plVar1 = ids->fStore;
    uVar5 = 0;
    do {
      *(long *)(local_150.super_TPZVec<int>.fStore + uVar5 * 2) = plVar1[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar9 != uVar5);
  }
  local_150.super_TPZVec<int>.fNElements = uVar9;
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)&local_150);
  if (local_150.super_TPZVec<int>.fStore != piVar2) {
    local_150.super_TPZVec<int>.fNAlloc = 0;
    local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_150.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_150.super_TPZVec<int>.fStore);
    }
  }
  local_150.super_TPZVec<int>.fStore = (int *)0x0;
  local_150.super_TPZVec<int>.fNElements = 0;
  local_150.super_TPZVec<int>.fNAlloc = 0;
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018237a0;
  uVar9 = sideorient->fNElements;
  if ((long)uVar9 < 0x15) {
    local_150.super_TPZVec<int>.fStore = piVar2;
    if ((long)uVar9 < 1) goto LAB_01007335;
  }
  else {
    local_150.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar9 >> 0x3e != 0) | uVar9 * 4);
    local_150.super_TPZVec<int>.fNAlloc = uVar9;
  }
  piVar3 = sideorient->fStore;
  uVar5 = 0;
  do {
    local_150.super_TPZVec<int>.fStore[uVar5] = piVar3[uVar5];
    uVar5 = uVar5 + 1;
  } while (uVar9 != uVar5);
LAB_01007335:
  local_150.super_TPZVec<int>.fNElements = uVar9;
  TPZManVector<int,_20>::operator=(&data->fSideOrient,&local_150);
  if (local_150.super_TPZVec<int>.fStore != piVar2) {
    local_150.super_TPZVec<int>.fNAlloc = 0;
    local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_150.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_150.super_TPZVec<int>.fStore);
    }
  }
  iVar6 = connectorders->fStore[4] + 1;
  TPZVec<int>::TPZVec(&local_150.super_TPZVec<int>,0);
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018896a0;
  local_150.super_TPZVec<int>.fStore = local_150.fExtAlloc;
  local_150.super_TPZVec<int>.fNElements = 0xb;
  local_150.super_TPZVec<int>.fNAlloc = 0;
  lVar4 = 0xb;
  auVar10 = _DAT_014d2b10;
  auVar12 = _DAT_014d28b0;
  do {
    if (SUB164(auVar12 ^ _DAT_014d28c0,4) == -0x80000000 &&
        SUB164(auVar12 ^ _DAT_014d28c0,0) < -0x7ffffff5) {
      aiStack_158[lVar4 + -1] = iVar6;
      aiStack_158[lVar4] = iVar6;
    }
    if (SUB164(auVar10 ^ _DAT_014d28c0,4) == -0x80000000 &&
        SUB164(auVar10 ^ _DAT_014d28c0,0) < -0x7ffffff5) {
      aiStack_158[lVar4 + 1] = iVar6;
      local_150.fExtAlloc[lVar4 + -8] = iVar6;
    }
    lVar11 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 4;
    auVar12._8_8_ = lVar11 + 4;
    lVar11 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 4;
    auVar10._8_8_ = lVar11 + 4;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x17);
  TPZShapeH1<pzshape::TPZShapeTetra>::Initialize
            (&(data->fCornerNodeIds).super_TPZVec<long>,&local_150.super_TPZVec<int>,data);
  if (connectorders->fNElements == 5) {
    local_c0.super_TPZVec<int>.fStore = local_c0.fExtAlloc;
    local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018896a0;
    local_c0.super_TPZVec<int>.fNElements = 5;
    local_c0.super_TPZVec<int>.fNAlloc = 0;
    piVar2 = connectorders->fStore;
    lVar4 = 0;
    do {
      local_c0.super_TPZVec<int>.fStore[lVar4] = piVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,&local_c0);
    if (local_c0.super_TPZVec<int>.fStore == local_c0.fExtAlloc) {
      local_c0.super_TPZVec<int>.fStore = (int *)0x0;
    }
    else {
      local_c0.super_TPZVec<int>.fNAlloc = 0;
      local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_c0.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(local_c0.super_TPZVec<int>.fStore);
      }
    }
    TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,5);
    piVar2 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore;
    piVar3 = (data->fHDivNumConnectShape).super_TPZVec<int>.fStore;
    lVar4 = 0;
    iVar6 = 0;
    do {
      iVar7 = piVar2[lVar4];
      iVar8 = iVar7 + 1;
      if (lVar4 == 4) {
        iVar8 = (iVar7 + 2) * iVar7;
      }
      iVar7 = (int)((iVar7 + (uint)(lVar4 == 4) + 2) * iVar8) / 2;
      piVar3[lVar4] = iVar7;
      iVar6 = iVar6 + iVar7;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    TPZManVector<std::pair<int,_long>,_60>::Resize(&data->fSDVecShapeIndex,(long)iVar6);
    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    iVar6 = (int)(data->fHDivConnectOrders).super_TPZVec<int>.fNElements;
    if (1 < (long)iVar6) {
      uVar9 = 0;
      do {
        if ((data->fHDivConnectOrders).super_TPZVec<int>.fStore[(long)iVar6 + -1] <
            (data->fHDivConnectOrders).super_TPZVec<int>.fStore[uVar9]) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                     ,0x3e);
        }
        uVar9 = uVar9 + 1;
      } while (iVar6 - 1 != uVar9);
    }
    if (local_150.super_TPZVec<int>.fStore != local_150.fExtAlloc) {
      local_150.super_TPZVec<int>.fNAlloc = 0;
      local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_150.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(local_150.super_TPZVec<int>.fStore);
      }
    }
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x26);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                      const TPZVec<int> &connectorders,
                                      const TPZVec<int>& sideorient,
                                      TPZShapeData &data)
{
    
        
    data.fCornerNodeIds = ids;
    data.fSideOrient = sideorient;
    const int ncon = TSHAPE::NFacets+1;
    //data.fHDivConnectOrders = connectorders;TODOPHIL
    int scalarorder = connectorders[TSHAPE::NFacets]+1;
    TPZManVector<int,27> scalarOrders(TSHAPE::NSides-TSHAPE::NCornerNodes,scalarorder);
    

    TPZShapeH1<TSHAPE>::Initialize(data.fCornerNodeIds, scalarOrders, data);
    if(connectorders.size() != TSHAPE::NFacets+1) DebugStop();
    
    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    int nShape = 0;
    for (int i = 0; i < TSHAPE::NFacets+1; i++)
    {
        int order = data.fHDivConnectOrders[i];
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,order);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);

    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    
    //Checks if the last connect order is >= then the other connects
    int size = data.fHDivConnectOrders.size();
    int maxOrder = data.fHDivConnectOrders[size-1];
    for (int i = 0; i < size-1; i++)
    {
        if (data.fHDivConnectOrders[i] > maxOrder){
            DebugStop();
        }
    }    
}